

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_raster_new(FT_Memory memory,gray_PRaster *araster)

{
  gray_PRaster pgVar1;
  gray_PRaster raster;
  gray_PRaster *ppgStack_18;
  FT_Error error;
  gray_PRaster *araster_local;
  FT_Memory memory_local;
  
  ppgStack_18 = araster;
  araster_local = (gray_PRaster *)memory;
  pgVar1 = (gray_PRaster)ft_mem_alloc(memory,8,(FT_Error *)((long)&raster + 4));
  if (raster._4_4_ == 0) {
    pgVar1->memory = araster_local;
  }
  *ppgStack_18 = pgVar1;
  return raster._4_4_;
}

Assistant:

static int
  gray_raster_new( FT_Memory      memory,
                   gray_PRaster*  araster )
  {
    FT_Error      error;
    gray_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }